

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_4447fb::FoldExpr::printLeft(FoldExpr *this,OutputStream *S)

{
  StringView local_78;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  StringView local_48;
  char *local_38;
  char *local_30;
  undefined1 local_28 [8];
  anon_class_16_2_d70826e2 PrintPack;
  OutputStream *S_local;
  FoldExpr *this_local;
  
  local_28 = (undefined1  [8])S;
  PrintPack.S = (OutputStream *)this;
  PrintPack.this = (FoldExpr *)S;
  OutputStream::operator+=(S,'(');
  if ((this->IsLeftFold & 1U) == 0) {
    printLeft::anon_class_16_2_d70826e2::operator()((anon_class_16_2_d70826e2 *)local_28);
    OutputStream::operator+=((OutputStream *)PrintPack.this,' ');
    local_68 = (this->OperatorName).First;
    local_60 = (this->OperatorName).Last;
    OutputStream::operator+=((OutputStream *)PrintPack.this,this->OperatorName);
    StringView::StringView(&local_78," ...");
    OutputStream::operator+=((OutputStream *)PrintPack.this,local_78);
    if (this->Init != (Node *)0x0) {
      OutputStream::operator+=((OutputStream *)PrintPack.this,' ');
      OutputStream::operator+=((OutputStream *)PrintPack.this,this->OperatorName);
      OutputStream::operator+=((OutputStream *)PrintPack.this,' ');
      Node::print(this->Init,(OutputStream *)PrintPack.this);
    }
  }
  else {
    if (this->Init != (Node *)0x0) {
      Node::print(this->Init,(OutputStream *)PrintPack.this);
      OutputStream::operator+=((OutputStream *)PrintPack.this,' ');
      local_38 = (this->OperatorName).First;
      local_30 = (this->OperatorName).Last;
      OutputStream::operator+=((OutputStream *)PrintPack.this,this->OperatorName);
      OutputStream::operator+=((OutputStream *)PrintPack.this,' ');
    }
    StringView::StringView(&local_48,"... ");
    OutputStream::operator+=((OutputStream *)PrintPack.this,local_48);
    local_58 = (this->OperatorName).First;
    local_50 = (this->OperatorName).Last;
    OutputStream::operator+=((OutputStream *)PrintPack.this,this->OperatorName);
    OutputStream::operator+=((OutputStream *)PrintPack.this,' ');
    printLeft::anon_class_16_2_d70826e2::operator()((anon_class_16_2_d70826e2 *)local_28);
  }
  OutputStream::operator+=((OutputStream *)PrintPack.this,')');
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    auto PrintPack = [&] {
      S += '(';
      ParameterPackExpansion(Pack).print(S);
      S += ')';
    };

    S += '(';

    if (IsLeftFold) {
      // init op ... op pack
      if (Init != nullptr) {
        Init->print(S);
        S += ' ';
        S += OperatorName;
        S += ' ';
      }
      // ... op pack
      S += "... ";
      S += OperatorName;
      S += ' ';
      PrintPack();
    } else { // !IsLeftFold
      // pack op ...
      PrintPack();
      S += ' ';
      S += OperatorName;
      S += " ...";
      // pack op ... op init
      if (Init != nullptr) {
        S += ' ';
        S += OperatorName;
        S += ' ';
        Init->print(S);
      }
    }
    S += ')';
  }